

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ahrens_beylkin.hpp
# Opt level: O0

int64_t IntegratorXX::quadrature_traits<IntegratorXX::AhrensBeylkin<double>,_void>::
        algebraic_order_by_npts(int64_t npts)

{
  int64_t npts_local;
  
  if (npts == 0x48) {
    npts_local = 0xe;
  }
  else if (npts == 0x84) {
    npts_local = 0x13;
  }
  else if (npts == 0xc0) {
    npts_local = 0x17;
  }
  else if (npts == 0x138) {
    npts_local = 0x1d;
  }
  else if (npts == 0x174) {
    npts_local = 0x20;
  }
  else if (npts == 0x1b0) {
    npts_local = 0x23;
  }
  else if (npts == 0x1ec) {
    npts_local = 0x25;
  }
  else if (npts == 0x228) {
    npts_local = 0x27;
  }
  else if (npts == 0x264) {
    npts_local = 0x29;
  }
  else if (npts == 0x2a0) {
    npts_local = 0x2c;
  }
  else if (npts == 0x2dc) {
    npts_local = 0x2d;
  }
  else if (npts == 0x318) {
    npts_local = 0x2f;
  }
  else if (npts == 0x390) {
    npts_local = 0x33;
  }
  else if (npts == 0x3cc) {
    npts_local = 0x35;
  }
  else if (npts == 0x408) {
    npts_local = 0x36;
  }
  else if (npts == 0x444) {
    npts_local = 0x38;
  }
  else if (npts == 0x4f8) {
    npts_local = 0x3c;
  }
  else if (npts == 0x534) {
    npts_local = 0x3e;
  }
  else if (npts == 0x570) {
    npts_local = 0x3f;
  }
  else if (npts == 0x5e8) {
    npts_local = 0x42;
  }
  else if (npts == 0x624) {
    npts_local = 0x43;
  }
  else if (npts == 0x660) {
    npts_local = 0x45;
  }
  else if (npts == 0x69c) {
    npts_local = 0x46;
  }
  else if (npts == 0x714) {
    npts_local = 0x48;
  }
  else if (npts == 0x78c) {
    npts_local = 0x4b;
  }
  else if (npts == 0x7c8) {
    npts_local = 0x4c;
  }
  else if (npts == 0x840) {
    npts_local = 0x4e;
  }
  else if (npts == 0x87c) {
    npts_local = 0x4f;
  }
  else if (npts == 0x8b8) {
    npts_local = 0x50;
  }
  else if (npts == 0x8f4) {
    npts_local = 0x51;
  }
  else if (npts == 0x96c) {
    npts_local = 0x54;
  }
  else if (npts == 0x9a8) {
    npts_local = 0x55;
  }
  else if (npts == 0xa98) {
    npts_local = 0x59;
  }
  else if (npts == 0xad4) {
    npts_local = 0x5a;
  }
  else if (npts == 0xb10) {
    npts_local = 0x5b;
  }
  else if (npts == 0xbc4) {
    npts_local = 0x5e;
  }
  else if (npts == 0xcf0) {
    npts_local = 0x62;
  }
  else if (npts == 0xd2c) {
    npts_local = 99;
  }
  else if (npts == 0xd68) {
    npts_local = 100;
  }
  else if (npts == 0xda4) {
    npts_local = 0x65;
  }
  else if (npts == 0xe1c) {
    npts_local = 0x67;
  }
  else if (npts == 0xed0) {
    npts_local = 0x69;
  }
  else if (npts == 0x1074) {
    npts_local = 0x6f;
  }
  else if (npts == 0x10ec) {
    npts_local = 0x71;
  }
  else if (npts == 0x11dc) {
    npts_local = 0x74;
  }
  else if (npts == 0x1254) {
    npts_local = 0x75;
  }
  else if (npts == 0x1380) {
    npts_local = 0x79;
  }
  else if (npts == 0x1470) {
    npts_local = 0x7c;
  }
  else if (npts == 0x1560) {
    npts_local = 0x7f;
  }
  else if (npts == 0x15d8) {
    npts_local = 0x80;
  }
  else if (npts == 0x168c) {
    npts_local = 0x82;
  }
  else if (npts == 0x1830) {
    npts_local = 0x87;
  }
  else if (npts == 0x18a8) {
    npts_local = 0x88;
  }
  else if (npts == 0x1b00) {
    npts_local = 0x8f;
  }
  else if (npts == 0x1d58) {
    npts_local = 0x95;
  }
  else if (npts == 0x3aa4) {
    npts_local = 0xd2;
  }
  else {
    npts_local = -1;
  }
  return npts_local;
}

Assistant:

inline static int64_t algebraic_order_by_npts(int64_t npts) {
  switch (npts) {
  case 72:
    return 14;
  case 132:
    return 19;
  case 192:
    return 23;
  case 312:
    return 29;
  case 372:
    return 32;
  case 432:
    return 35;
  case 492:
    return 37;
  case 552:
    return 39;
  case 612:
    return 41;
  case 672:
    return 44;
  case 732:
    return 45;
  case 792:
    return 47;
  case 912:
    return 51;
  case 972:
    return 53;
  case 1032:
    return 54;
  case 1092:
    return 56;
  case 1272:
    return 60;
  case 1332:
    return 62;
  case 1392:
    return 63;
  case 1512:
    return 66;
  case 1572:
    return 67;
  case 1632:
    return 69;
  case 1692:
    return 70;
  case 1812:
    return 72;
  case 1932:
    return 75;
  case 1992:
    return 76;
  case 2112:
    return 78;
  case 2172:
    return 79;
  case 2232:
    return 80;
  case 2292:
    return 81;
  case 2412:
    return 84;
  case 2472:
    return 85;
  case 2712:
    return 89;
  case 2772:
    return 90;
  case 2832:
    return 91;
  case 3012:
    return 94;
  case 3312:
    return 98;
  case 3372:
    return 99;
  case 3432:
    return 100;
  case 3492:
    return 101;
  case 3612:
    return 103;
  case 3792:
    return 105;
  case 4212:
    return 111;
  case 4332:
    return 113;
  case 4572:
    return 116;
  case 4692:
    return 117;
  case 4992:
    return 121;
  case 5232:
    return 124;
  case 5472:
    return 127;
  case 5592:
    return 128;
  case 5772:
    return 130;
  case 6192:
    return 135;
  case 6312:
    return 136;
  case 6912:
    return 143;
  case 7512:
    return 149;
  case 15012:
    return 210;
  default:
    return -1;
  }
}